

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<TPZFlopCounter>::Subst_Forward
          (TPZMatrix<TPZFlopCounter> *this,TPZFMatrix<TPZFlopCounter> *B)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar2;
  int64_t i;
  long lVar3;
  int64_t c;
  long lVar4;
  int64_t r;
  long lVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double local_50;
  double local_38;
  
  lVar5 = (B->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar2 = 0;
  if ((lVar5 == CONCAT44(extraout_var,iVar1)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    lVar5 = 0;
    while( true ) {
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
      if (CONCAT44(extraout_var_00,iVar1) <= lVar5) break;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar5);
      for (lVar4 = 0; lVar4 < (B->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fCol;
          lVar4 = lVar4 + 1) {
        local_50 = 0.0;
        for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar3);
          (*(B->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(B,lVar3,lVar4);
          local_50 = local_50 + extraout_XMM0_Qa_01 * extraout_XMM0_Qa_00;
          TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
          TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
        }
        (*(B->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(B,lVar5,lVar4);
        TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
        TPZFlopCounter::gCount.fCount[2] = TPZFlopCounter::gCount.fCount[2] + 1;
        local_38 = (extraout_XMM0_Qa_02 - local_50) / extraout_XMM0_Qa;
        (*(B->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x23])(B,lVar5,lVar4,&local_38);
      }
      lVar5 = lVar5 + 1;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}